

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_symlink_dir.c
# Opt level: O0

void test_symlink_dir(void)

{
  wchar_t wVar1;
  char *in_RAX;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  wchar_t in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  undefined4 in_stack_00000030;
  wchar_t in_stack_00000034;
  char *in_stack_00000038;
  undefined4 in_stack_00000090;
  wchar_t in_stack_00000094;
  char *in_stack_00000098;
  wchar_t in_stack_000000a4;
  char *in_stack_000000a8;
  char *pcVar2;
  
  assertion_umask((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(wchar_t)((ulong)in_RAX >> 0x20),
                  (wchar_t)in_RAX);
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  systemf("%s -cf test.tar -C source dir dir2 dir3 file file2",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                      (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x118317,
                      (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'B');
    test_skipping("some symlink checks");
  }
  else {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x11837a);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x118399);
  }
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x11840d);
  }
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x118460);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x11847f);
  }
  systemf("%s -xf test.tar -C dest1",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                      (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x1184c5,
                      (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  failure("symlink to dir was followed when it shouldn\'t be");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Broken symlink wasn\'t replaced with dir");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Symlink to non-dir wasn\'t replaced with dir");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Symlink to existing file should be replaced");
  assertion_is_reg(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Symlink to non-existing file should be replaced");
  assertion_is_reg(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x1185ff);
  }
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x118628);
  }
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x11867b);
  }
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x1186ce);
  }
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x1186f7);
  }
  systemf("%s -xPf test.tar -C dest2",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                      (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x11873d,
                      (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x118766);
    assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  }
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  assertion_is_reg(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  assertion_file_size(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,
                      CONCAT44(in_stack_00000094,in_stack_00000090));
  failure("Broken symlink wasn\'t replaced with dir");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Symlink to non-dir wasn\'t replaced with dir");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Symlink to existing file should be removed");
  assertion_is_reg(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("Symlink to non-existing file should be removed");
  assertion_is_reg(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  return;
}

Assistant:

DEFINE_TEST(test_symlink_dir)
{
	assertUmask(0);

	assertMakeDir("source", 0755);
	assertMakeFile("source/file", 0755, "a");
	assertMakeFile("source/file2", 0755, "ab");
	assertMakeDir("source/dir", 0755);
	assertMakeDir("source/dir/d", 0755);
	assertMakeFile("source/dir/f", 0755, "abc");
	assertMakeDir("source/dir2", 0755);
	assertMakeDir("source/dir2/d2", 0755);
	assertMakeFile("source/dir2/f2", 0755, "abcd");
	assertMakeDir("source/dir3", 0755);
	assertMakeDir("source/dir3/d3", 0755);
	assertMakeFile("source/dir3/f3", 0755, "abcde");

	assertEqualInt(0,
	    systemf("%s -cf test.tar -C source dir dir2 dir3 file file2",
		testprog));

	/*
	 * Extract with -x and without -P.
	 */
	assertMakeDir("dest1", 0755);
	/* "dir" is a symlink to an existing "dest1/real_dir" */
	assertMakeDir("dest1/real_dir", 0755);
	if (canSymlink()) {
		assertMakeSymlink("dest1/dir", "real_dir");
		/* "dir2" is a symlink to a non-existing "real_dir2" */
		assertMakeSymlink("dest1/dir2", "real_dir2");
	} else {
		skipping("some symlink checks");
	}
	/* "dir3" is a symlink to an existing "non_dir3" */
	assertMakeFile("dest1/non_dir3", 0755, "abcdef");
	if (canSymlink())
		assertMakeSymlink("dest1/dir3", "non_dir3");
	/* "file" is a symlink to existing "real_file" */
	assertMakeFile("dest1/real_file", 0755, "abcdefg");
	if (canSymlink()) {
		assertMakeSymlink("dest1/file", "real_file");
		/* "file2" is a symlink to non-existing "real_file2" */
		assertMakeSymlink("dest1/file2", "real_file2");
	}
	assertEqualInt(0, systemf("%s -xf test.tar -C dest1", testprog));

	/* dest1/dir symlink should be replaced */
	failure("symlink to dir was followed when it shouldn't be");
	assertIsDir("dest1/dir", -1);
	/* dest1/dir2 symlink should be replaced */
	failure("Broken symlink wasn't replaced with dir");
	assertIsDir("dest1/dir2", -1);
	/* dest1/dir3 symlink should be replaced */
	failure("Symlink to non-dir wasn't replaced with dir");
	assertIsDir("dest1/dir3", -1);
	/* dest1/file symlink should be replaced */
	failure("Symlink to existing file should be replaced");
	assertIsReg("dest1/file", -1);
	/* dest1/file2 symlink should be replaced */
	failure("Symlink to non-existing file should be replaced");
	assertIsReg("dest1/file2", -1);

	/*
	 * Extract with both -x and -P
	 */
	assertMakeDir("dest2", 0755);
	/* "dir" is a symlink to existing "real_dir" */
	assertMakeDir("dest2/real_dir", 0755);
	if (canSymlink())
		assertMakeSymlink("dest2/dir", "real_dir");
	/* "dir2" is a symlink to a non-existing "real_dir2" */
	if (canSymlink())
		assertMakeSymlink("dest2/dir2", "real_dir2");
	/* "dir3" is a symlink to an existing "non_dir3" */
	assertMakeFile("dest2/non_dir3", 0755, "abcdefgh");
	if (canSymlink())
		assertMakeSymlink("dest2/dir3", "non_dir3");
	/* "file" is a symlink to existing "real_file" */
	assertMakeFile("dest2/real_file", 0755, "abcdefghi");
	if (canSymlink())
		assertMakeSymlink("dest2/file", "real_file");
	/* "file2" is a symlink to non-existing "real_file2" */
	if (canSymlink())
		assertMakeSymlink("dest2/file2", "real_file2");
	assertEqualInt(0, systemf("%s -xPf test.tar -C dest2", testprog));

	/* dest2/dir symlink should be followed */
	if (canSymlink()) {
		assertIsSymlink("dest2/dir", "real_dir");
		assertIsDir("dest2/real_dir", -1);
	}

	/* Contents of 'dir' should be restored */
	assertIsDir("dest2/dir/d", -1);
	assertIsReg("dest2/dir/f", -1);
	assertFileSize("dest2/dir/f", 3);
	/* dest2/dir2 symlink should be removed */
	failure("Broken symlink wasn't replaced with dir");
	assertIsDir("dest2/dir2", -1);
	/* dest2/dir3 symlink should be removed */
	failure("Symlink to non-dir wasn't replaced with dir");
	assertIsDir("dest2/dir3", -1);
	/* dest2/file symlink should be removed;
	 * even -P shouldn't follow symlinks for files */
	failure("Symlink to existing file should be removed");
	assertIsReg("dest2/file", -1);
	/* dest2/file2 symlink should be removed */
	failure("Symlink to non-existing file should be removed");
	assertIsReg("dest2/file2", -1);
}